

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlGetListFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,JlDataObject **pListObject)

{
  JL_STATUS JVar1;
  JlDataObject *object;
  
  if (pListObject != (JlDataObject **)0x0 &&
      (KeyName != (char *)0x0 && DictionaryObject != (JlDataObject *)0x0)) {
    *pListObject = (JlDataObject *)0x0;
    object = (JlDataObject *)0x0;
    JVar1 = JlGetObjectFromDictionaryByKey(DictionaryObject,KeyName,&object);
    if (JVar1 == JL_STATUS_SUCCESS) {
      if (object->Type == JL_DATA_TYPE_LIST) {
        *pListObject = object;
        JVar1 = JL_STATUS_SUCCESS;
      }
      else {
        JVar1 = JL_STATUS_WRONG_TYPE;
      }
    }
    return JVar1;
  }
  return JL_STATUS_INVALID_PARAMETER;
}

Assistant:

JL_STATUS
    JlGetListFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        JlDataObject**              pListObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pListObject )
    {
        *pListObject = NULL;

        JlDataObject* object = NULL;
        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, KeyName, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            if( JL_DATA_TYPE_LIST == object->Type )
            {
                *pListObject = object;
            }
            else
            {
                jlStatus = JL_STATUS_WRONG_TYPE;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}